

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_nodes.cpp
# Opt level: O3

shared_ptr<duckdb::BoundParameterData,_true> __thiscall
duckdb::BoundParameterData::Deserialize(BoundParameterData *this,Deserializer *deserializer)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  BoundParameterData *pBVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<duckdb::BoundParameterData,_true> sVar4;
  Value value;
  LogicalType local_b8;
  Value local_a0;
  Value local_60;
  
  (*deserializer->_vptr_Deserializer[2])(deserializer,100,"value");
  (*deserializer->_vptr_Deserializer[6])(deserializer);
  Value::Deserialize(&local_60,deserializer);
  (*deserializer->_vptr_Deserializer[7])(deserializer);
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  pBVar3 = (BoundParameterData *)operator_new(0x58);
  Value::Value(&local_a0,&local_60);
  BoundParameterData(pBVar3,&local_a0);
  *(BoundParameterData **)&(this->value).type_ = pBVar3;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<duckdb::BoundParameterData*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&(this->value).type_.type_info_,pBVar3);
  Value::~Value(&local_a0);
  pBVar3 = shared_ptr<duckdb::BoundParameterData,_true>::operator->
                     ((shared_ptr<duckdb::BoundParameterData,_true> *)this);
  (*deserializer->_vptr_Deserializer[2])(deserializer,0x65,"return_type");
  (*deserializer->_vptr_Deserializer[6])(deserializer);
  LogicalType::Deserialize(&local_b8,deserializer);
  (*deserializer->_vptr_Deserializer[7])(deserializer);
  (pBVar3->return_type).id_ = local_b8.id_;
  (pBVar3->return_type).physical_type_ = local_b8.physical_type_;
  peVar1 = (pBVar3->return_type).type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var2 = (pBVar3->return_type).type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (pBVar3->return_type).type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_b8.type_info_.internal.
       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (pBVar3->return_type).type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_b8.type_info_.internal.
       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  local_b8.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = peVar1;
  local_b8.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = p_Var2;
  LogicalType::~LogicalType(&local_b8);
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  Value::~Value(&local_60);
  sVar4.internal.super___shared_ptr<duckdb::BoundParameterData,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  sVar4.internal.super___shared_ptr<duckdb::BoundParameterData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       this;
  return (shared_ptr<duckdb::BoundParameterData,_true>)
         sVar4.internal.super___shared_ptr<duckdb::BoundParameterData,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<BoundParameterData> BoundParameterData::Deserialize(Deserializer &deserializer) {
	auto value = deserializer.ReadProperty<Value>(100, "value");
	auto result = duckdb::shared_ptr<BoundParameterData>(new BoundParameterData(value));
	deserializer.ReadProperty<LogicalType>(101, "return_type", result->return_type);
	return result;
}